

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::SetBinaryDirectory(cmState *this,string *binaryDirectory)

{
  string *path;
  string local_38;
  
  path = &this->BinaryDirectory;
  std::__cxx11::string::_M_assign((string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  cmsys::SystemTools::CollapseFullPath(&local_38,path);
  cmsys::SystemTools::SplitPath(&local_38,&this->BinaryDirectoryComponents,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmState::SetBinaryDirectory(std::string const& binaryDirectory)
{
  this->BinaryDirectory = binaryDirectory;
  cmSystemTools::ConvertToUnixSlashes(this->BinaryDirectory);

  cmSystemTools::SplitPath(
      cmSystemTools::CollapseFullPath(this->BinaryDirectory),
        this->BinaryDirectoryComponents);
}